

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O2

void __thiscall NaPNTrainDataGath::action(NaPNTrainDataGath *this)

{
  NaPetriCnInput *this_00;
  NaPetriCnInput *this_01;
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  NaVector *pNVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NaVector *pNVar10;
  undefined4 extraout_var_01;
  ulong uVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar12;
  long lVar13;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char *pcVar14;
  NaPetriNet *pNVar15;
  NaTimer *pNVar16;
  ulong uVar17;
  int j;
  long lVar18;
  int i;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  
  if (this->bTurnedOn == true) {
    this_00 = &this->in1;
    pNVar9 = NaPetriCnInput::data(this_00);
    iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->par[0].vSeries,(value_type *)CONCAT44(extraout_var,iVar5));
    this_01 = &this->in2;
    pNVar9 = NaPetriCnInput::data(this_01);
    iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->par[1].vSeries,(value_type *)CONCAT44(extraout_var_00,iVar5));
    pNVar9 = NaPetriCnInput::data(this_00);
    pNVar10 = NaPetriCnOutput::data(&this->out1);
    (*pNVar10->_vptr_NaVector[2])(pNVar10,pNVar9);
    pNVar9 = NaPetriCnInput::data(this_01);
    pNVar10 = NaPetriCnOutput::data(&this->out2);
    (*pNVar10->_vptr_NaVector[2])(pNVar10,pNVar9);
    pNVar9 = NaPetriCnOutput::data(&this->turnoff);
    iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
    *(undefined8 *)CONCAT44(extraout_var_01,iVar5) = 0;
    NaPetriCnOutput::commit_data(&this->out1);
    NaPetriCnOutput::commit_data(&this->out2);
    uVar11 = (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar17 = (ulong)this->nStDetLen;
    if (uVar11 < uVar17) {
      pNVar9 = NaPetriCnInput::data(this_00);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      this->par[0].fSum = *(double *)CONCAT44(extraout_var_02,iVar5) + this->par[0].fSum;
      pNVar9 = NaPetriCnInput::data(this_00);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      dVar20 = *(double *)CONCAT44(extraout_var_03,iVar5);
      pNVar9 = NaPetriCnInput::data(this_00);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      this->par[0].fSum2 = dVar20 * *(double *)CONCAT44(extraout_var_04,iVar5) + this->par[0].fSum2;
      pNVar9 = NaPetriCnInput::data(this_01);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      this->par[1].fSum = *(double *)CONCAT44(extraout_var_05,iVar5) + this->par[1].fSum;
      pNVar9 = NaPetriCnInput::data(this_01);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      dVar20 = *(double *)CONCAT44(extraout_var_06,iVar5);
      pNVar9 = NaPetriCnInput::data(this_01);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      this->par[1].fSum2 = dVar20 * *(double *)CONCAT44(extraout_var_07,iVar5) + this->par[1].fSum2;
    }
    else if (uVar11 == uVar17) {
      pcVar14 = NaPetriNode::name(&this->super_NaPetriNode);
      pNVar15 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar16 = NaPetriNet::timer(pNVar15);
      uVar6 = (*pNVar16->_vptr_NaTimer[5])(pNVar16);
      NaPrintLog("\'%s\' calculated statistics (at %d):\n",pcVar14,(ulong)uVar6);
      for (lVar18 = 0x2f8; lVar18 != 0x3a8; lVar18 = lVar18 + 0x58) {
        lVar12 = *(long *)((long)&(this->super_NaPetriNode)._vptr_NaPetriNode + lVar18) -
                 *(long *)((long)this + lVar18 + -8);
        lVar13 = lVar12 >> 3;
        auVar19._8_4_ = (int)(lVar12 >> 0x23);
        auVar19._0_8_ = lVar13;
        auVar19._12_4_ = 0x45300000;
        dVar20 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
        dVar21 = *(double *)((long)this + lVar18 + -0x18) / dVar20;
        *(double *)((long)this + lVar18 + -0x38) = dVar21;
        dVar20 = *(double *)((long)this + lVar18 + -0x10) / dVar20 - dVar21 * dVar21;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        *(double *)((long)this + lVar18 + -0x30) = dVar20;
        dVar21 = *(double *)((long)this + lVar18 + -0x38);
        dVar2 = *(double *)((long)this + lVar18 + -0x40);
        pdVar1 = (double *)((long)this + lVar18 + -0x28);
        *pdVar1 = dVar21 + dVar20 * -dVar2;
        pdVar1[1] = dVar21 + dVar20 * dVar2;
        NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n");
      }
      for (uVar11 = 0;
          pdVar3 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)this->par[0].vSeries.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar3 >> 3);
          uVar11 = uVar11 + 1) {
        iVar5 = Parameters::cellIndex(this->par,pdVar3[uVar11]);
        iVar7 = Parameters::cellIndex
                          (this->par + 1,
                           this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar11]);
        iVar7 = iVar5 * this->par[1].nCells + iVar7;
        piVar4 = this->mxHits;
        iVar5 = piVar4[iVar7];
        if (iVar5 == 0) {
          this->nNonZeroHits = this->nNonZeroHits + 1;
          iVar5 = piVar4[iVar7];
        }
        piVar4[iVar7] = iVar5 + 1;
      }
      pcVar14 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar5 = this->par[1].nCells;
      uVar6 = this->nNonZeroHits;
      iVar7 = this->par[0].nCells;
      pNVar15 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar16 = NaPetriNet::timer(pNVar15);
      uVar8 = (*pNVar16->_vptr_NaTimer[5])(pNVar16);
      NaPrintLog("\'%s\' has %d non-zero cells (%4.1f%%) (at %d)\n",
                 ((double)(int)uVar6 * 100.0) / (double)(iVar5 * iVar7),pcVar14,(ulong)uVar6,
                 (ulong)uVar8);
    }
    else if (uVar17 < uVar11) {
      pNVar9 = NaPetriCnInput::data(this_00);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      iVar5 = Parameters::cellIndex(this->par,*(NaReal *)CONCAT44(extraout_var_09,iVar5));
      pNVar9 = NaPetriCnInput::data(this_01);
      iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      iVar7 = Parameters::cellIndex(this->par + 1,*(NaReal *)CONCAT44(extraout_var_10,iVar7));
      iVar7 = iVar5 * this->par[1].nCells + iVar7;
      piVar4 = this->mxHits;
      iVar5 = piVar4[iVar7];
      if (iVar5 == 0) {
        this->nNonZeroHits = this->nNonZeroHits + 1;
        iVar5 = piVar4[iVar7];
      }
      piVar4[iVar7] = iVar5 + 1;
    }
    if (this->fMinHits <=
        ((double)this->nNonZeroHits * 100.0) / (double)(this->par[1].nCells * this->par[0].nCells))
    {
      pNVar9 = NaPetriCnOutput::data(&this->turnoff);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      *(undefined8 *)CONCAT44(extraout_var_11,iVar5) = 0x3ff0000000000000;
      this->bTurnedOn = false;
      pcVar14 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar5 = this->par[1].nCells;
      uVar6 = this->nNonZeroHits;
      iVar7 = this->par[0].nCells;
      pNVar15 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar16 = NaPetriNet::timer(pNVar15);
      uVar8 = (*pNVar16->_vptr_NaTimer[5])(pNVar16);
      NaPrintLog("\'%s\' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
                 ((double)(int)uVar6 * 100.0) / (double)(iVar5 * iVar7),pcVar14,(ulong)uVar6,
                 (ulong)uVar8);
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])(this);
      return;
    }
  }
  else {
    iVar5 = NaPetriConnector::links(&(this->turnon).super_NaPetriConnector);
    if (0 < iVar5) {
      pNVar9 = NaPetriCnInput::data(&this->turnon);
      iVar5 = (*pNVar9->_vptr_NaVector[8])(pNVar9,0);
      if ((*(double *)CONCAT44(extraout_var_08,iVar5) != 0.0) ||
         (NAN(*(double *)CONCAT44(extraout_var_08,iVar5)))) {
        this->bTurnedOn = true;
        pcVar14 = NaPetriNode::name(&this->super_NaPetriNode);
        pNVar15 = NaPetriNode::net(&this->super_NaPetriNode);
        pNVar16 = NaPetriNet::timer(pNVar15);
        uVar6 = (*pNVar16->_vptr_NaTimer[5])(pNVar16);
        NaPrintLog("\'%s\' is ON (at %d)\n",pcVar14,(ulong)uVar6);
        piVar4 = this->mxHits;
        for (lVar18 = 0; lVar18 < (long)this->par[1].nCells * (long)this->par[0].nCells;
            lVar18 = lVar18 + 1) {
          piVar4[lVar18] = 0;
        }
        this->nNonZeroHits = 0;
        this->par[0].fSum = 0.0;
        this->par[0].fSum2 = 0.0;
        this->par[1].fSum = 0.0;
        this->par[1].fSum2 = 0.0;
        pdVar3 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        pdVar3 = this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void
NaPNTrainDataGath::action ()
{
  if(bTurnedOn)
    {
      par[0].vSeries.push_back(in1.data()[0]);
      par[1].vSeries.push_back(in2.data()[0]);
      /*
      NaPrintLog("'%s' gathered data at %d\n",
		 name(), net()->timer().CurrentIndex());
      */
      // Pass data through the node
      out1.data() = in1.data();
      out2.data() = in2.data();
      turnoff.data()[0] = 0;

      out1.commit_data();
      out2.commit_data();

      if(par[0].vSeries.size() < nStDetLen)
	{
	  par[0].fSum += in1.data()[0];
	  par[0].fSum2 += in1.data()[0] * in1.data()[0];

	  par[1].fSum += in2.data()[0];
	  par[1].fSum2 += in2.data()[0] * in2.data()[0];
	}
      else if(par[0].vSeries.size() == nStDetLen)
	{
	  NaPrintLog("'%s' calculated statistics (at %d):\n",
		     name(), net()->timer().CurrentIndex());
	  for(int i = 0; i < 2; ++i)
	    {
	      par[i].fAvg = par[i].fSum / par[i].vSeries.size();
	      par[i].fSigma = sqrt(par[i].fSum2 / par[i].vSeries.size()
				   - par[i].fAvg * par[i].fAvg);
	      par[i].fRange[0] = par[i].fAvg - par[i].fNSigma * par[i].fSigma;
	      par[i].fRange[1] = par[i].fAvg + par[i].fNSigma * par[i].fSigma;
	      NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n",
			 par[i].fAvg, par[i].fSigma,
			 par[i].fRange[0], par[i].fRange[1]);
	    }

	  // make classification for previous inputs
	  for(int j = 0; j < par[0].vSeries.size(); ++j)
	    {
	      int	i1 = par[0].cellIndex(par[0].vSeries[j]);
	      int	i2 = par[1].cellIndex(par[1].vSeries[j]);
	      int	i = i1 * par[1].nCells + i2;
	      if(mxHits[i] == 0)
		++nNonZeroHits;
	      ++mxHits[i];
	    }
	  NaPrintLog("'%s' has %d non-zero cells (%4.1f%%) (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	}
      else if(par[0].vSeries.size() > nStDetLen)
	{
	  int	i1 = par[0].cellIndex(in1.data()[0]);
	  int	i2 = par[1].cellIndex(in2.data()[0]);
	  int	i = i1 * par[1].nCells + i2;
	  if(mxHits[i] == 0)
	    ++nNonZeroHits;
	  ++mxHits[i];
	}

      if(100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells) >= fMinHits)
	{
	  turnoff.data()[0] = 1;
	  bTurnedOn = false;

	  NaPrintLog("'%s' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	  halt();
	}
    }
  else if(turnon.links() > 0)
    if(0 != turnon.data()[0])
      {
	bTurnedOn = true;

	NaPrintLog("'%s' is ON (at %d)\n",
		   name(), net()->timer().CurrentIndex());

	for(int i = 0; i < par[0].nCells * par[1].nCells; ++i)
	  mxHits[i] = 0;
	nNonZeroHits = 0;

	par[0].fSum = par[1].fSum = 0.0;
	par[0].fSum2 = par[1].fSum2 = 0.0;

	par[0].vSeries.clear();
	par[1].vSeries.clear();
      }
}